

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long lVar2;
  bool opt;
  char *pcVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (argc != 3) {
    pcVar3 = "Usage: ./compile_test /path_to_source_code -use_mode";
    lVar2 = 0x34;
LAB_00124d5b:
    poVar1 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,lVar2);
    lVar2 = std::cerr;
LAB_00124d66:
    std::ios::widen((char)*(undefined8 *)(lVar2 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return -1;
  }
  if (*argv[2] != '-') {
    pcVar3 = "please \'-\' + option";
    lVar2 = 0x13;
    goto LAB_00124d5b;
  }
  switch(argv[2][1]) {
  case '1':
    TestLexicalAnalysis(argv[1]);
    break;
  case '2':
    TestGrammaAnalysis(argv[1]);
    break;
  case '3':
    TestSemanticAnalysis(argv[1]);
    break;
  case '4':
    pcVar3 = argv[1];
    opt = false;
    goto LAB_00124db9;
  case '5':
    pcVar3 = argv[1];
    opt = true;
LAB_00124db9:
    TestGenerate(pcVar3,opt,false);
    return 0;
  case '6':
    TestGenerate(argv[1],true,true);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"invalid option: ",0x10);
    uStack_18 = CONCAT17(argv[2][1],(undefined7)uStack_18);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)((long)&uStack_18 + 7),1);
    lVar2 = *(long *)poVar1;
    goto LAB_00124d66;
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    if (argc != 3) {
        std::cerr << "Usage: ./compile_test /path_to_source_code -use_mode" << endl;
        return -1;
    } else {
        for (int i=2; i<3; ++i) {
            if (argv[i][0] == '-') {
                switch(argv[i][1]) {
                    case '1': TestLexicalAnalysis(argv[1]); break;
                    case '2': TestGrammaAnalysis(argv[1]); break;
                    case '3': TestSemanticAnalysis(argv[1]); break;
                    case '4': TestGenerate(argv[1], false, false); break;
                    case '5': TestGenerate(argv[1], true, false); break;
                    case '6': TestGenerate(argv[1], true, true); break;
                    default: {
                        std::cerr << "invalid option: " << argv[i][1] << endl;
                        return -1;
                    }
                }
            } else {
                std::cerr << "please '-' + option" << endl;
                return -1;
            }
        }
    }
    return 0;
}